

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarnessHandlers.hpp
# Opt level: O2

void __thiscall XSTSTest::XSTSTest(XSTSTest *this)

{
  xercesc_4_0::RefVectorOf<xercesc_4_0::XMLURL>::RefVectorOf
            (&this->fXSDNames,1,true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLURL::XMLURL(&this->fXMLName,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLURL::XMLURL(&this->fSpecReference,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this->fTestName[0] = L'\0';
  this->fExpectedResult = unknown;
  this->fSkipped = false;
  return;
}

Assistant:

XSTSTest() :
      fXSDNames(1) 
    {
        fTestName[0]=0;
        fExpectedResult=unknown;
        fSkipped=false;
    }